

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CatalogReader.hpp
# Opt level: O0

CourseComponent * __thiscall CatalogReader::constructCourse(CatalogReader *this,ifstream *fin)

{
  int iVar1;
  ostream *poVar2;
  size_type sVar3;
  Course *pCVar4;
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [39];
  undefined1 local_1a9;
  string local_1a8 [32];
  string local_188 [32];
  Course *local_168;
  CourseComponent *course;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140 [32];
  string local_120 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  int local_d4;
  undefined1 local_d0 [4];
  int units;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prereqList;
  string combined;
  string local_98 [8];
  string prerequisites;
  string local_78 [8];
  string courseTitle;
  string local_58 [8];
  string courseDescription;
  string local_38 [8];
  string courseName;
  ifstream *fin_local;
  CatalogReader *this_local;
  
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::string(local_58);
  std::__cxx11::string::string(local_78);
  std::__cxx11::string::string(local_98);
  std::__cxx11::string::string
            ((string *)
             &prereqList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d0);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)fin,local_38);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)fin,local_78);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)fin,local_98);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)fin,local_58);
  if ((this->debugOn & 1U) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"--- FILE TEXT ---");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,local_38);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,local_78);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,local_98);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,local_58);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"-----------------");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::string(local_120,local_98);
  getPrereqs(&local_100,this,(string *)local_120);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_d0,&local_100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100);
  std::__cxx11::string::~string(local_120);
  local_d4 = getCourseUnits(this,(string *)local_78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&course,
                 (char *)local_78);
  std::operator+(local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&course);
  std::__cxx11::string::operator=
            ((string *)
             &prereqList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_140);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string((string *)&course);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d0);
  if (sVar3 == 0) {
    pCVar4 = (Course *)operator_new(0x68);
    local_1a9 = 1;
    std::__cxx11::string::string(local_188,local_38);
    iVar1 = local_d4;
    std::__cxx11::string::string
              (local_1a8,
               (string *)
               &prereqList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Prerequisite::Prerequisite((Prerequisite *)pCVar4,(string *)local_188,iVar1,(string *)local_1a8)
    ;
    local_1a9 = 0;
    local_168 = pCVar4;
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string(local_188);
  }
  else {
    pCVar4 = (Course *)operator_new(0x88);
    std::__cxx11::string::string(local_1d0,local_38);
    iVar1 = local_d4;
    std::__cxx11::string::string
              (local_1f0,
               (string *)
               &prereqList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::string(local_210,local_98);
    Course::Course(pCVar4,(string *)local_1d0,iVar1,(string *)local_1f0,(string *)local_210);
    local_168 = pCVar4;
    std::__cxx11::string::~string(local_210);
    std::__cxx11::string::~string(local_1f0);
    std::__cxx11::string::~string(local_1d0);
  }
  if ((this->debugOn & 1U) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"-- COURSE CREATED --");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    (*(local_168->super_CourseComponent).super_Observer._vptr_Observer[8])();
    poVar2 = std::operator<<((ostream *)&std::cout,"--------------------");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)fin,local_38);
  pCVar4 = local_168;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d0);
  std::__cxx11::string::~string
            ((string *)
             &prereqList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return &pCVar4->super_CourseComponent;
}

Assistant:

CourseComponent* constructCourse(ifstream& fin) const {
			string courseName, courseDescription, courseTitle, prerequisites, combined;
			vector<string> prereqList;
			int units;

			getline(fin, courseName);
			getline(fin, courseTitle);
			getline(fin, prerequisites);
			getline(fin, courseDescription);
			
			if (debugOn) {
				cout << "--- FILE TEXT ---" << endl;
				cout << courseName << endl << courseTitle << endl << prerequisites << endl << courseDescription << endl;
				cout << "-----------------" << endl;
			}

			prereqList = getPrereqs(prerequisites);
			units = getCourseUnits(courseTitle);

			combined = courseTitle + "\n" + courseDescription;

			CourseComponent* course;
			if (prereqList.size() == 0) {
				course = new Prerequisite(courseName, units, combined);
			} else {
				course = new Course(courseName, units, combined, prerequisites);
			}

			if (debugOn) {
				cout << "-- COURSE CREATED --" << endl;
				course->displayCourseInfo();
				cout << "--------------------" << endl;
			}

			getline(fin, courseName); // one more time so the it skips the empty space

			return course;
		}